

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cpp
# Opt level: O0

void crc32(void *key,int len,uint32_t seed,void *out)

{
  uint uVar1;
  byte *pbVar2;
  uint32_t crc;
  uint8_t *buf;
  void *out_local;
  uint32_t seed_local;
  int len_local;
  void *key_local;
  
  crc = seed ^ 0xffffffff;
  buf = (uint8_t *)key;
  for (len_local = len; 7 < len_local; len_local = len_local + -8) {
    uVar1 = crc_table[(int)((crc ^ *buf) & 0xff)] ^ crc >> 8;
    uVar1 = crc_table[(int)((uVar1 ^ buf[1]) & 0xff)] ^ uVar1 >> 8;
    uVar1 = crc_table[(int)((uVar1 ^ buf[2]) & 0xff)] ^ uVar1 >> 8;
    uVar1 = crc_table[(int)((uVar1 ^ buf[3]) & 0xff)] ^ uVar1 >> 8;
    uVar1 = crc_table[(int)((uVar1 ^ buf[4]) & 0xff)] ^ uVar1 >> 8;
    uVar1 = crc_table[(int)((uVar1 ^ buf[5]) & 0xff)] ^ uVar1 >> 8;
    pbVar2 = buf + 7;
    uVar1 = crc_table[(int)((uVar1 ^ buf[6]) & 0xff)] ^ uVar1 >> 8;
    buf = buf + 8;
    crc = crc_table[(int)((uVar1 ^ *pbVar2) & 0xff)] ^ uVar1 >> 8;
  }
  while (len_local != 0) {
    crc = crc_table[(int)((crc ^ *buf) & 0xff)] ^ crc >> 8;
    buf = buf + 1;
    len_local = len_local + -1;
  }
  *(uint32_t *)out = crc ^ 0xffffffff;
  return;
}

Assistant:

void crc32 ( const void * key, int len, uint32_t seed, void * out )
{
  uint8_t * buf = (uint8_t*)key;
  uint32_t crc = seed ^ 0xffffffffL;

  while (len >= 8)
  {
    DO8(buf);
    len -= 8;
  }

  while(len--)
  {
    DO1(buf);
  } 

  crc ^= 0xffffffffL;

  *(uint32_t*)out = crc;
}